

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

pointer __thiscall
absl::
InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
::data(InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
       *this)

{
  bool bVar1;
  undefined8 local_30;
  InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
  *this_local;
  
  bVar1 = inlined_vector_internal::
          Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
          ::GetIsAllocated(&this->storage_);
  if (bVar1) {
    local_30 = inlined_vector_internal::
               Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
               ::GetAllocatedData(&this->storage_);
  }
  else {
    local_30 = inlined_vector_internal::
               Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
               ::GetInlinedData(&this->storage_);
  }
  return local_30;
}

Assistant:

pointer data() noexcept ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return storage_.GetIsAllocated() ? storage_.GetAllocatedData()
                                     : storage_.GetInlinedData();
  }